

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O2

Sentence * __thiscall
jhu::thrax::split(Sentence *__return_storage_ptr__,thrax *this,string_view line)

{
  _Iter_pred<jhu::thrax::__0> *p_Var1;
  bool bVar2;
  int iVar3;
  _Iter_pred<jhu::thrax::__0> *p_Var4;
  thrax *__it;
  _Iter_pred<jhu::thrax::__0> *__it_00;
  difference_type __n;
  long lVar5;
  _Iter_pred<jhu::thrax::__0> *this_00;
  _Iter_pred<jhu::thrax::__0> *p_Var6;
  thrax *ptVar7;
  long lVar8;
  Sentence *result;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  p_Var6 = (_Iter_pred<jhu::thrax::__0> *)line._M_len;
  p_Var1 = p_Var6 + (long)this;
  lVar5 = 0;
  __it = this;
  for (ptVar7 = (thrax *)0x0; this != ptVar7; ptVar7 = ptVar7 + 1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()
                      (p_Var6 + (long)ptVar7,(char *)__it);
    lVar5 = lVar5 + (ulong)bVar2;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(__return_storage_ptr__,lVar5 + 1);
  if ((split(std::basic_string_view<char,std::char_traits<char>>)::notSpace == '\0') &&
     (iVar3 = __cxa_guard_acquire(&split(std::basic_string_view<char,std::char_traits<char>>)::
                                   notSpace), iVar3 != 0)) {
    __cxa_guard_release(&split(std::basic_string_view<char,std::char_traits<char>>)::notSpace);
  }
  do {
    __it_00 = p_Var1;
    p_Var4 = (_Iter_pred<jhu::thrax::__0> *)
             std::find_if<char_const*,std::_Not_fn<jhu::thrax::__0>>(p_Var6);
    if (p_Var1 <= p_Var4) {
      return __return_storage_ptr__;
    }
    lVar5 = (long)p_Var1 - (long)p_Var4;
    this_00 = p_Var4;
    for (lVar8 = lVar5 >> 2; p_Var6 = this_00, 0 < lVar8; lVar8 = lVar8 + -1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()(this_00,(char *)__it_00);
      if (bVar2) goto LAB_0010461e;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()(this_00 + 1,(char *)__it_00)
      ;
      p_Var6 = this_00 + 1;
      if (bVar2) goto LAB_0010461e;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()(this_00 + 2,(char *)__it_00)
      ;
      p_Var6 = this_00 + 2;
      if (bVar2) goto LAB_0010461e;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()(this_00 + 3,(char *)__it_00)
      ;
      p_Var6 = this_00 + 3;
      if (bVar2) goto LAB_0010461e;
      this_00 = this_00 + 4;
      lVar5 = lVar5 + -4;
    }
    if (lVar5 == 1) {
LAB_00104647:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()(this_00,(char *)__it_00);
      p_Var6 = this_00;
      if (!bVar2) {
        p_Var6 = p_Var1;
      }
    }
    else if (lVar5 == 2) {
LAB_0010460f:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()(p_Var6,(char *)__it_00);
      if (!bVar2) {
        this_00 = p_Var6 + 1;
        goto LAB_00104647;
      }
    }
    else {
      p_Var6 = p_Var1;
      if ((lVar5 == 3) &&
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<jhu::thrax::$_0>::operator()(this_00,(char *)__it_00)
         , p_Var6 = this_00, !bVar2)) {
        p_Var6 = this_00 + 1;
        goto LAB_0010460f;
      }
    }
LAB_0010461e:
    local_40._M_len = (long)p_Var6 - (long)p_Var4;
    local_40._M_str = (char *)p_Var4;
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,&local_40);
  } while( true );
}

Assistant:

inline Sentence split(std::string_view line) {
  auto spaces = std::count_if(line.begin(), line.end(), isSpace);
  Sentence result;
  result.reserve(spaces + 1);  // estimate
  static const auto notSpace = std::not_fn(isSpace);
  auto s = std::find_if(line.begin(), line.end(), notSpace);
  for (auto e = s; s < line.end(); s = std::find_if(e, line.end(), notSpace)) {
    e = std::find_if(s, line.end(), isSpace);
    size_t len = std::distance(s, e);
    result.push_back({ s, len });
  }
  return result;
}